

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# INTEGER.c
# Opt level: O0

xer_pbd_rval
INTEGER__xer_body_decode(asn_TYPE_descriptor_t *td,void *sptr,void *chunk_buf,size_t chunk_size)

{
  long lVar1;
  int iVar2;
  asn_strtol_result_e aVar3;
  asn_INTEGER_specifics_t *paVar4;
  long in_RCX;
  asn_INTEGER_specifics_t *in_RDX;
  long *in_RSI;
  asn_INTEGER_enum_map_t *el;
  int lv;
  char *dec_value_end;
  char *dec_value_start;
  anon_enum_32 state;
  char *lstop;
  char *lstart;
  char *lp;
  long hex_value;
  long dec_value;
  INTEGER_t *st;
  undefined8 in_stack_ffffffffffffff50;
  INTEGER_t *in_stack_ffffffffffffff58;
  asn_INTEGER_enum_map_t *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff8c;
  asn_INTEGER_specifics_t *lstart_00;
  asn_INTEGER_specifics_t *specs;
  uint local_5c;
  asn_INTEGER_specifics_t *local_48;
  long local_40;
  long local_38;
  long *local_30;
  xer_pbd_rval local_4;
  
  local_40 = 0;
  paVar4 = (asn_INTEGER_specifics_t *)((long)&in_RDX->value2enum + in_RCX);
  local_5c = 0;
  specs = (asn_INTEGER_specifics_t *)0x0;
  lstart_00 = (asn_INTEGER_specifics_t *)0x0;
  local_30 = in_RSI;
  if (in_RCX != 0) {
    ASN_DEBUG("INTEGER body %ld 0x%2x..0x%2x",in_RCX,(ulong)(uint)(int)*(char *)&in_RDX->value2enum,
              (ulong)(uint)(int)(char)paVar4[-1].field_0x27);
  }
  iVar2 = INTEGER_st_prealloc(in_stack_ffffffffffffff58,
                              (int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
  local_48 = in_RDX;
  if (iVar2 != 0) {
    return XPBD_SYSTEM_FAILURE;
  }
  for (; local_48 < paVar4; local_48 = (asn_INTEGER_specifics_t *)((long)&local_48->value2enum + 1))
  {
    in_stack_ffffffffffffff8c = (uint)*(char *)&local_48->value2enum;
    switch(in_stack_ffffffffffffff8c) {
    case 9:
    case 10:
    case 0xd:
    case 0x20:
      if (1 < local_5c) {
        if (local_5c == 3) {
          local_5c = 4;
          lstart_00 = local_48;
        }
        else if ((local_5c != 4) && (local_5c != 7)) {
          if (local_5c != 8) goto switchD_00150c05_caseD_b;
          local_5c = 7;
        }
      }
      break;
    default:
switchD_00150c05_caseD_b:
      ASN_DEBUG("INTEGER :: Found non-numeric 0x%2x at %ld",(ulong)in_stack_ffffffffffffff8c,
                (long)local_48 - (long)in_RDX);
      local_5c = 10;
      goto LAB_00150ff9;
    case 0x2b:
      if (local_5c != 0) goto switchD_00150c05_caseD_b;
      local_38 = 0;
      local_5c = 2;
      specs = local_48;
      break;
    case 0x2d:
      if (local_5c != 0) goto switchD_00150c05_caseD_b;
      local_38 = 0;
      local_5c = 2;
      specs = local_48;
      break;
    case 0x30:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
      switch(local_5c) {
      case 0:
        local_38 = 0;
        specs = local_48;
      case 2:
        local_5c = 3;
        break;
      case 1:
      case 5:
        local_40 = (long)(int)((in_stack_ffffffffffffff8c - 0x30) * 0x10);
        local_5c = 6;
        break;
      case 3:
        break;
      default:
        goto switchD_00150c05_caseD_b;
      case 6:
        local_40 = (int)(in_stack_ffffffffffffff8c - 0x30) + local_40;
        local_5c = 8;
        lVar1 = local_30[1];
        *(int *)(local_30 + 1) = (int)lVar1 + 1;
        *(char *)(*local_30 + (long)(int)lVar1) = (char)local_40;
        break;
      case 8:
        return XPBD_BROKEN_ENCODING;
      }
      break;
    case 0x3a:
      if (local_5c == 8) {
        local_5c = 5;
      }
      else {
        if (local_5c != 3) {
          ASN_DEBUG("state %d at %ld",(ulong)local_5c,(long)local_48 - (long)in_RDX);
          goto switchD_00150c05_caseD_b;
        }
        ASN_DEBUG("INTEGER re-evaluate as hex form");
        local_5c = 1;
        local_48 = (asn_INTEGER_specifics_t *)&in_RDX[-1].field_0x27;
        specs = (asn_INTEGER_specifics_t *)0x0;
      }
      break;
    case 0x3c:
      if (local_5c != 0) {
        return XPBD_BROKEN_ENCODING;
      }
      in_stack_ffffffffffffff80 =
           INTEGER_map_enum2value
                     (specs,(char *)lstart_00,
                      (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      if (in_stack_ffffffffffffff80 == (asn_INTEGER_enum_map_t *)0x0) {
        ASN_DEBUG("Unknown identifier for INTEGER");
        return XPBD_BROKEN_ENCODING;
      }
      ASN_DEBUG("Found \"%s\" => %ld",in_stack_ffffffffffffff80->enum_name,
                in_stack_ffffffffffffff80->nat_value);
      local_38 = in_stack_ffffffffffffff80->nat_value;
      local_5c = 9;
      local_48 = (asn_INTEGER_specifics_t *)&paVar4[-1].field_0x27;
      break;
    case 0x41:
    case 0x42:
    case 0x43:
    case 0x44:
    case 0x45:
    case 0x46:
    case 0x61:
    case 0x62:
    case 99:
    case 100:
    case 0x65:
    case 0x66:
      switch(local_5c) {
      case 0:
      case 1:
      case 5:
        iVar2 = 0x61;
        if ((int)in_stack_ffffffffffffff8c < 0x61) {
          iVar2 = 0x41;
        }
        local_40 = ((long)(int)(in_stack_ffffffffffffff8c - iVar2) + 10) * 0x10;
        local_5c = 6;
        break;
      default:
        goto switchD_00150c05_caseD_b;
      case 3:
        ASN_DEBUG("INTEGER re-evaluate as hex form");
        local_5c = 1;
        specs = (asn_INTEGER_specifics_t *)0x0;
        local_48 = (asn_INTEGER_specifics_t *)&in_RDX[-1].field_0x27;
        break;
      case 6:
        iVar2 = 0x61;
        if ((int)in_stack_ffffffffffffff8c < 0x61) {
          iVar2 = 0x41;
        }
        local_40 = (int)(in_stack_ffffffffffffff8c - iVar2) + local_40 + 10;
        lVar1 = local_30[1];
        *(int *)(local_30 + 1) = (int)lVar1 + 1;
        *(char *)(*local_30 + (long)(int)lVar1) = (char)local_40;
        local_5c = 8;
      }
    }
  }
LAB_00150ff9:
  switch(local_5c) {
  case 0:
    local_4 = XPBD_NOT_BODY_IGNORE;
    break;
  case 1:
  case 5:
  case 6:
    local_4 = XPBD_BROKEN_ENCODING;
    break;
  case 2:
  case 10:
    ASN_DEBUG("INTEGER: No useful digits (state %d)",(ulong)local_5c);
    local_4 = XPBD_BROKEN_ENCODING;
    break;
  case 3:
  case 4:
    aVar3 = asn_strtol_lim((char *)specs,(char **)&stack0xffffffffffffff90,&local_38);
    switch(aVar3) {
    case ASN_STRTOL_OK:
      break;
    case ASN_STRTOL_ERROR_RANGE:
      return XPBD_DECODER_LIMIT;
    case ASN_STRTOL_ERROR_INVAL:
    case ASN_STRTOL_EXPECT_MORE:
    case ASN_STRTOL_EXTRA_DATA:
      return XPBD_BROKEN_ENCODING;
    }
  default:
switchD_0015101f_default:
    iVar2 = asn_long2INTEGER((INTEGER_t *)
                             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                             (long)in_stack_ffffffffffffff80);
    if (iVar2 == 0) {
      local_4 = XPBD_BODY_CONSUMED;
    }
    else {
      local_4 = XPBD_SYSTEM_FAILURE;
    }
    break;
  case 7:
  case 8:
    *(undefined1 *)(*local_30 + (long)(int)local_30[1]) = 0;
    local_4 = XPBD_BODY_CONSUMED;
    break;
  case 9:
    goto switchD_0015101f_default;
  }
  return local_4;
}

Assistant:

static enum xer_pbd_rval
INTEGER__xer_body_decode(asn_TYPE_descriptor_t *td, void *sptr, const void *chunk_buf, size_t chunk_size) {
	INTEGER_t *st = (INTEGER_t *)sptr;
	long dec_value;
	long hex_value = 0;
	const char *lp;
	const char *lstart = (const char *)chunk_buf;
	const char *lstop = lstart + chunk_size;
	enum {
		ST_LEADSPACE,
		ST_SKIPSPHEX,
		ST_WAITDIGITS,
		ST_DIGITS,
		ST_DIGITS_TRAILSPACE,
		ST_HEXDIGIT1,
		ST_HEXDIGIT2,
		ST_HEXDIGITS_TRAILSPACE,
		ST_HEXCOLON,
		ST_END_ENUM,
		ST_UNEXPECTED
	} state = ST_LEADSPACE;
	const char *dec_value_start = 0; /* INVARIANT: always !0 in ST_DIGITS */
	const char *dec_value_end = 0;

	if(chunk_size)
		ASN_DEBUG("INTEGER body %ld 0x%2x..0x%2x",
			(long)chunk_size, *lstart, lstop[-1]);

	if(INTEGER_st_prealloc(st, (chunk_size/3) + 1))
		return XPBD_SYSTEM_FAILURE;

	/*
	 * We may have received a tag here. It will be processed inline.
	 * Use strtoul()-like code and serialize the result.
	 */
	for(lp = lstart; lp < lstop; lp++) {
		int lv = *lp;
		switch(lv) {
		case 0x09: case 0x0a: case 0x0d: case 0x20:
			switch(state) {
			case ST_LEADSPACE:
			case ST_DIGITS_TRAILSPACE:
			case ST_HEXDIGITS_TRAILSPACE:
			case ST_SKIPSPHEX:
				continue;
			case ST_DIGITS:
				dec_value_end = lp;
				state = ST_DIGITS_TRAILSPACE;
				continue;
			case ST_HEXCOLON:
				state = ST_HEXDIGITS_TRAILSPACE;
				continue;
			default:
				break;
			}
			break;
		case 0x2d:	/* '-' */
			if(state == ST_LEADSPACE) {
				dec_value = 0;
				dec_value_start = lp;
				state = ST_WAITDIGITS;
				continue;
			}
			break;
		case 0x2b:	/* '+' */
			if(state == ST_LEADSPACE) {
				dec_value = 0;
				dec_value_start = lp;
				state = ST_WAITDIGITS;
				continue;
			}
			break;
		case 0x30: case 0x31: case 0x32: case 0x33: case 0x34:
		case 0x35: case 0x36: case 0x37: case 0x38: case 0x39:
			switch(state) {
			case ST_DIGITS: continue;
			case ST_SKIPSPHEX:	/* Fall through */
			case ST_HEXDIGIT1:
				hex_value = (lv - 0x30) << 4;
				state = ST_HEXDIGIT2;
				continue;
			case ST_HEXDIGIT2:
				hex_value += (lv - 0x30);
				state = ST_HEXCOLON;
				st->buf[st->size++] = (uint8_t)hex_value;
				continue;
			case ST_HEXCOLON:
				return XPBD_BROKEN_ENCODING;
			case ST_LEADSPACE:
				dec_value = 0;
				dec_value_start = lp;
				/* FALL THROUGH */
			case ST_WAITDIGITS:
				state = ST_DIGITS;
				continue;
			default:
				break;
			}
			break;
		case 0x3c:	/* '<', start of XML encoded enumeration */
			if(state == ST_LEADSPACE) {
				const asn_INTEGER_enum_map_t *el;
				el = INTEGER_map_enum2value(
					(asn_INTEGER_specifics_t *)
					td->specifics, lstart, lstop);
				if(el) {
					ASN_DEBUG("Found \"%s\" => %ld",
						el->enum_name, el->nat_value);
					dec_value = el->nat_value;
					state = ST_END_ENUM;
					lp = lstop - 1;
					continue;
				}
				ASN_DEBUG("Unknown identifier for INTEGER");
			}
			return XPBD_BROKEN_ENCODING;
		case 0x3a:	/* ':' */
			if(state == ST_HEXCOLON) {
				/* This colon is expected */
				state = ST_HEXDIGIT1;
				continue;
			} else if(state == ST_DIGITS) {
				/* The colon here means that we have
				 * decoded the first two hexadecimal
				 * places as a decimal value.
				 * Switch decoding mode. */
				ASN_DEBUG("INTEGER re-evaluate as hex form");
				state = ST_SKIPSPHEX;
				dec_value_start = 0;
				lp = lstart - 1;
				continue;
			} else {
				ASN_DEBUG("state %d at %ld", state, (long)(lp - lstart));
				break;
			}
		/* [A-Fa-f] */
		case 0x41:case 0x42:case 0x43:case 0x44:case 0x45:case 0x46:
		case 0x61:case 0x62:case 0x63:case 0x64:case 0x65:case 0x66:
			switch(state) {
			case ST_SKIPSPHEX:
			case ST_LEADSPACE: /* Fall through */
			case ST_HEXDIGIT1:
				hex_value = lv - ((lv < 0x61) ? 0x41 : 0x61);
				hex_value += 10;
				hex_value <<= 4;
				state = ST_HEXDIGIT2;
				continue;
			case ST_HEXDIGIT2:
				hex_value += lv - ((lv < 0x61) ? 0x41 : 0x61);
				hex_value += 10;
				st->buf[st->size++] = (uint8_t)hex_value;
				state = ST_HEXCOLON;
				continue;
			case ST_DIGITS:
				ASN_DEBUG("INTEGER re-evaluate as hex form");
				state = ST_SKIPSPHEX;
				dec_value_start = 0;
				lp = lstart - 1;
				continue;
			default:
				break;
			}
			break;
		}

		/* Found extra non-numeric stuff */
		ASN_DEBUG("INTEGER :: Found non-numeric 0x%2x at %ld",
			lv, (long)(lp - lstart));
		state = ST_UNEXPECTED;
		break;
	}

	switch(state) {
	case ST_END_ENUM:
		/* Got a complete and valid enumeration encoded as a tag. */
		break;
	case ST_DIGITS:
		dec_value_end = lstop;
		/* FALL THROUGH */
	case ST_DIGITS_TRAILSPACE:
		/* The last symbol encountered was a digit. */
		switch(asn_strtol_lim(dec_value_start, &dec_value_end, &dec_value)) {
		case ASN_STRTOL_OK:
			break;
		case ASN_STRTOL_ERROR_RANGE:
			return XPBD_DECODER_LIMIT;
		case ASN_STRTOL_ERROR_INVAL:
		case ASN_STRTOL_EXPECT_MORE:
		case ASN_STRTOL_EXTRA_DATA:
			return XPBD_BROKEN_ENCODING;
		}
		break;
	case ST_HEXCOLON:
	case ST_HEXDIGITS_TRAILSPACE:
		st->buf[st->size] = 0;	/* Just in case termination */
		return XPBD_BODY_CONSUMED;
	case ST_HEXDIGIT1:
	case ST_HEXDIGIT2:
	case ST_SKIPSPHEX:
		return XPBD_BROKEN_ENCODING;
	case ST_LEADSPACE:
		/* Content not found */
		return XPBD_NOT_BODY_IGNORE;
	case ST_WAITDIGITS:
	case ST_UNEXPECTED:
		ASN_DEBUG("INTEGER: No useful digits (state %d)", state);
		return XPBD_BROKEN_ENCODING;	/* No digits */
	}

	/*
	 * Convert the result of parsing of enumeration or a straight
	 * decimal value into a BER representation.
	 */
	if(asn_long2INTEGER(st, dec_value))
		return XPBD_SYSTEM_FAILURE;

	return XPBD_BODY_CONSUMED;
}